

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_disk_io.cpp
# Opt level: O0

void __thiscall libtorrent::mmap_disk_io::update_stats_counters(mmap_disk_io *this,counters *c)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  undefined1 local_28 [8];
  unique_lock<std::mutex> jl;
  counters *c_local;
  mmap_disk_io *this_local;
  
  jl._8_8_ = c;
  ::std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_28,&this->m_job_mutex);
  uVar1 = jl._8_8_;
  iVar2 = libtorrent::aux::disk_job_pool<libtorrent::aux::mmap_disk_job>::read_jobs_in_use
                    (&this->m_job_pool);
  counters::set_value((counters *)uVar1,0xf6,(long)iVar2);
  uVar1 = jl._8_8_;
  iVar2 = libtorrent::aux::disk_job_pool<libtorrent::aux::mmap_disk_job>::write_jobs_in_use
                    (&this->m_job_pool);
  counters::set_value((counters *)uVar1,0xf7,(long)iVar2);
  uVar1 = jl._8_8_;
  iVar2 = libtorrent::aux::disk_job_pool<libtorrent::aux::mmap_disk_job>::jobs_in_use
                    (&this->m_job_pool);
  counters::set_value((counters *)uVar1,0xf8,(long)iVar2);
  uVar1 = jl._8_8_;
  iVar2 = libtorrent::aux::disk_io_thread_pool::queue_size(&this->m_generic_threads);
  iVar3 = libtorrent::aux::disk_io_thread_pool::queue_size(&this->m_hash_threads);
  counters::set_value((counters *)uVar1,0xf4,(long)(iVar2 + iVar3));
  ::std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_28);
  uVar1 = jl._8_8_;
  iVar2 = libtorrent::aux::disk_buffer_pool::in_use(&this->m_buffer_pool);
  counters::set_value((counters *)uVar1,0xf3,(long)iVar2);
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return;
}

Assistant:

void mmap_disk_io::update_stats_counters(counters& c) const
	{
		// These are atomic_counts, so it's safe to access them from
		// a different thread
		std::unique_lock<std::mutex> jl(m_job_mutex);

		c.set_value(counters::num_read_jobs, m_job_pool.read_jobs_in_use());
		c.set_value(counters::num_write_jobs, m_job_pool.write_jobs_in_use());
		c.set_value(counters::num_jobs, m_job_pool.jobs_in_use());
		c.set_value(counters::queued_disk_jobs, m_generic_threads.queue_size()
			+ m_hash_threads.queue_size());

		jl.unlock();

		// gauges
		c.set_value(counters::disk_blocks_in_use, m_buffer_pool.in_use());
	}